

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void duckdb::roaring::RoaringCompressState::HandleByte
               (RoaringCompressState *state,uint8_t array_index)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,array_index);
  if (iVar1 == 0) {
    HandleNoneValid(state,8);
    return;
  }
  if (iVar1 == 0xff) {
    HandleAllValid(state,8);
    return;
  }
  HandleRaggedByte(state,array_index,8);
  return;
}

Assistant:

void RoaringCompressState::HandleByte(RoaringCompressState &state, uint8_t array_index) {
	if (array_index == NumericLimits<uint8_t>::Maximum()) {
		HandleAllValid(state, 8);
	} else if (array_index == 0) {
		HandleNoneValid(state, 8);
	} else {
		HandleRaggedByte(state, array_index, 8);
	}
}